

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9aae6d::ProbModelXMLScopeFunctor::operator()(ProbModelXMLScopeFunctor *this)

{
  TwoStageDynamicBayesianNetwork *this_00;
  ParserProbModelXML *this_01;
  FactoredDecPOMDPDiscrete *this_02;
  xmlNodeSetPtr pxVar1;
  bool bVar2;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  ParserProbModelXML *this_03;
  xmlNodePtr pxVar5;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar6;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar7;
  vector<Scope,_std::allocator<Scope>_> *pvVar8;
  ParserProbModelXML *pPVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  EParse *this_04;
  long lVar11;
  ParserProbModelXML *pPVar12;
  Scope *pSVar13;
  elm_type eVar14;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_05;
  Index IVar15;
  ulong uVar16;
  ParserProbModelXML *pPVar17;
  Scope XSoI;
  Scope ASoILocal;
  Scope YSoI;
  Scope ASoI;
  Scope YSoI_1;
  Scope OSoI;
  vector<_xmlNode_*,_std::allocator<_xmlNode_*>_> reward_links;
  string child_name;
  string parent_name;
  string local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  string local_70;
  string local_50;
  
  this_01 = this->_m_parser;
  this_02 = this->_m_fDecPOMDP;
  pxVar4 = ParserProbModelXML::GetNodesMatchingExpression
                     (this_01,(xmlChar *)"/ProbModelXML/ProbNet/Links/Link[@directed=\'true\']",
                      (xmlNodePtr)0x0);
  if (pxVar4 == (xmlXPathObjectPtr)0x0) {
    this_04 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(this_04,"No links were found in target file.");
    __cxa_throw(this_04,&EParse::typeinfo,E::~E);
  }
  pxVar1 = pxVar4->nodesetval;
  lVar11 = 0;
  reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn;
  for (pPVar12 = (ParserProbModelXML *)0x0; (long)pPVar12 < (long)pxVar1->nodeNr;
      pPVar12 = (ParserProbModelXML *)
                ((long)&(pPVar12->super_ParserInterface)._vptr_ParserInterface + 1)) {
    pPVar17 = pPVar12;
    this_03 = (ParserProbModelXML *)
              xmlFirstElementChild(*(undefined8 *)((long)pxVar1->nodeTab + lVar11));
    pxVar5 = (xmlNodePtr)xmlLastElementChild(*(undefined8 *)((long)pxVar1->nodeTab + lVar11));
    pPVar9 = (ParserProbModelXML *)&parent_name;
    ParserProbModelXML::GetVariableName_abi_cxx11_((string *)pPVar9,pPVar17,(xmlNodePtr)this_03);
    iVar3 = ParserProbModelXML::GetVariableTimeslice(pPVar9,(xmlNodePtr)this_03);
    ParserProbModelXML::GetVariableName_abi_cxx11_(&child_name,this_03,pxVar5);
    std::__cxx11::string::string((string *)&local_70,(string *)&parent_name);
    pVar6 = ParserProbModelXML::GetParsedElement(this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_50,(string *)&child_name);
    pVar7 = ParserProbModelXML::GetParsedElement(this_01,&local_50);
    uVar16 = (ulong)pVar7 >> 0x20;
    std::__cxx11::string::~string((string *)&local_50);
    ASoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    YSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ASoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ASoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    YSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    YSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    eVar14 = pVar7.first;
    if (eVar14 == STATE) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&ASoI.super_SDT,
                 &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_ASoI_Y
                  .super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data
                  ._M_start[uVar16].super_SDT);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&XSoI.super_SDT,
                 &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_XSoI_Y
                  .super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data
                  ._M_start[uVar16].super_SDT);
      pvVar8 = &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_YSoI_Y;
LAB_004a10ad:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&YSoI.super_SDT,
                 &(pvVar8->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16].super_SDT);
      IVar15 = pVar6.second;
      if (pVar6.first == ACTION) {
        if (this_01->_m_asynchronousModel == true) {
          Scope::Insert(&ASoILocal,IVar15);
          IVar15 = 0;
        }
        bVar2 = Scope::Contains(&ASoI,IVar15);
        pSVar13 = &ASoI;
LAB_004a112b:
        if (bVar2 == false) {
          Scope::Insert(pSVar13,IVar15);
        }
      }
      else if (pVar6.first == STATE) {
        if (iVar3 == 0) {
          bVar2 = Scope::Contains(&XSoI,IVar15);
          pSVar13 = &XSoI;
        }
        else {
          bVar2 = Scope::Contains(&YSoI,IVar15);
          pSVar13 = &YSoI;
        }
        goto LAB_004a112b;
      }
      IVar15 = pVar7.second;
      if (eVar14 == OBSERVATION) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"<>",(allocator<char> *)&OSoI);
        Scope::Scope(&YSoI_1,&local_d8);
        TwoStageDynamicBayesianNetwork::SetSoI_O(this_00,IVar15,&XSoI,&ASoI,&YSoI,&YSoI_1);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSoI_1);
        std::__cxx11::string::~string((string *)&local_d8);
        if ((this_01->_m_asynchronousModel == true) &&
           (ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,
                     &ASoILocal.super_SDT);
          this_05 = &local_a0;
          ParserProbModelXML::AddToLocalObsActionScope(this_01,IVar15,(Scope *)this_05);
LAB_004a125e:
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_05);
        }
      }
      else if (eVar14 == STATE) {
        TwoStageDynamicBayesianNetwork::SetSoI_Y(this_00,IVar15,&XSoI,&ASoI,&YSoI);
        if ((this_01->_m_asynchronousModel == true) &&
           (ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            ASoILocal.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                     &ASoILocal.super_SDT);
          this_05 = &local_88;
          ParserProbModelXML::AddToLocalSFActionScope(this_01,IVar15,(Scope *)this_05);
          goto LAB_004a125e;
        }
      }
    }
    else {
      if (eVar14 == OBSERVATION) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&XSoI.super_SDT,
                   &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                    _m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16].super_SDT);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&ASoI.super_SDT,
                   &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn.
                    _m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16].super_SDT);
        pvVar8 = &(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_2dbn._m_YSoI_O
        ;
        goto LAB_004a10ad;
      }
      if (eVar14 == REWARD) {
        std::vector<_xmlNode_*,_std::allocator<_xmlNode_*>_>::push_back
                  (&reward_links,(value_type *)((long)pxVar1->nodeTab + lVar11));
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSoI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSoI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ASoILocal);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ASoI);
    std::__cxx11::string::~string((string *)&child_name);
    std::__cxx11::string::~string((string *)&parent_name);
    lVar11 = lVar11 + 8;
  }
  uVar16 = 0;
  do {
    if ((ulong)((long)reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar16) {
      xmlXPathFreeObject(pxVar4);
      std::_Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>::~_Vector_base
                (&reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>);
      return;
    }
    pPVar9 = (ParserProbModelXML *)
             xmlFirstElementChild
                       (reward_links.super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16]);
    pxVar5 = (xmlNodePtr)
             xmlLastElementChild(reward_links.
                                 super__Vector_base<_xmlNode_*,_std::allocator<_xmlNode_*>_>._M_impl
                                 .super__Vector_impl_data._M_start[uVar16]);
    ParserProbModelXML::GetVariableName_abi_cxx11_(&parent_name,pPVar12,(xmlNodePtr)pPVar9);
    ParserProbModelXML::GetVariableName_abi_cxx11_(&child_name,pPVar12,pxVar5);
    std::__cxx11::string::string((string *)&local_d8,(string *)&parent_name);
    pVar6 = ParserProbModelXML::GetParsedElement(this_01,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string((string *)&ASoI,(string *)&child_name);
    pVar7 = ParserProbModelXML::GetParsedElement(this_01,(string *)&ASoI);
    pPVar17 = (ParserProbModelXML *)((ulong)pVar7 >> 0x20);
    std::__cxx11::string::~string((string *)&ASoI);
    pvVar10 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*(long *)&(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates
                                     ).super_MultiAgentDecisionProcess + 0x288))(this_02,pPVar17);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&ASoILocal.super_SDT,pvVar10);
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar10 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*(long *)&(this_02->super_MultiAgentDecisionProcessDiscreteFactoredStates
                                     ).super_MultiAgentDecisionProcess + 0x280))(this_02,pPVar17);
    pPVar12 = (ParserProbModelXML *)&YSoI;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar12,pvVar10);
    YSoI_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    OSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    YSoI_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    YSoI_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    OSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    OSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = ParserProbModelXML::GetVariableTimeslice(pPVar12,(xmlNodePtr)pPVar9);
    IVar15 = pVar6.second;
    eVar14 = pVar6.first;
    if (iVar3 == 0) {
      if (eVar14 == STATE) {
        bVar2 = Scope::Contains(&YSoI,IVar15);
        pSVar13 = &YSoI;
      }
      else {
        if (eVar14 != ACTION) goto LAB_004a151f;
        if (this_01->_m_asynchronousModel == true) {
          Scope::Insert(&XSoI,IVar15);
          IVar15 = 0;
        }
        bVar2 = Scope::Contains(&ASoILocal,IVar15);
        pSVar13 = &ASoILocal;
      }
      if (bVar2 == false) goto LAB_004a14a6;
LAB_004a14ae:
      pPVar9 = pPVar17;
      FactoredDecPOMDPDiscrete::SetScopeForLRF(this_02,pVar7.second,&YSoI,&ASoILocal,&YSoI_1,&OSoI);
      if ((this_01->_m_asynchronousModel == true) &&
         (XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          XSoI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,&XSoI.super_SDT)
        ;
        ParserProbModelXML::AddToLocalLRFActionScope(this_01,pVar7.second,(Scope *)&local_b8);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b8);
        pPVar9 = pPVar17;
      }
    }
    else {
      if (eVar14 == STATE) {
        pSVar13 = &YSoI_1;
LAB_004a14a6:
        Scope::Insert(pSVar13,IVar15);
        goto LAB_004a14ae;
      }
      if (eVar14 == OBSERVATION) {
        pSVar13 = &OSoI;
        goto LAB_004a14a6;
      }
    }
LAB_004a151f:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&OSoI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSoI_1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSoI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSoI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ASoILocal);
    std::__cxx11::string::~string((string *)&child_name);
    std::__cxx11::string::~string((string *)&parent_name);
    uVar16 = uVar16 + 1;
    pPVar12 = pPVar9;
  } while( true );
}

Assistant:

void operator()(){SetScopes(_m_parser,_m_fDecPOMDP);}